

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

void __thiscall Omega_h::Comm::bcast<signed_char>(Comm *this,char *x,int root_rank)

{
  return;
}

Assistant:

void Comm::bcast(T& x, int root_rank) const {
#ifdef OMEGA_H_USE_MPI
  CALL(MPI_Bcast(&x, 1, MpiTraits<T>::datatype(), root_rank, impl_));
#else
  (void)x;
  (void)root_rank;
#endif
}